

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

socket_t __thiscall httplib::ClientImpl::create_client_socket(ClientImpl *this,Error *error)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  pointer ppVar4;
  function<void_(int)> local_e0;
  _Self local_c0;
  _Self local_b8;
  const_iterator it;
  string ip;
  function<void_(int)> local_80;
  string local_60;
  Error *local_40;
  Error *error_local;
  ClientImpl *this_local;
  
  local_40 = error;
  error_local = (Error *)this;
  bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->proxy_host_);
  if ((bVar3) || (this->proxy_port_ == -1)) {
    std::__cxx11::string::string((string *)&it);
    local_b8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->addr_map_,&this->host_);
    local_c0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->addr_map_);
    bVar3 = std::operator==(&local_b8,&local_c0);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_b8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                 &ppVar4->second);
    }
    iVar1 = this->port_;
    iVar2 = this->address_family_;
    bVar3 = this->tcp_nodelay_;
    std::function<void_(int)>::function(&local_e0,&this->socket_options_);
    this_local._4_4_ =
         detail::create_client_socket
                   (&this->host_,(string *)&it,iVar1,iVar2,(bool)(bVar3 & 1),&local_e0,
                    this->connection_timeout_sec_,this->connection_timeout_usec_,
                    this->read_timeout_sec_,this->read_timeout_usec_,this->write_timeout_sec_,
                    this->write_timeout_usec_,&this->interface_,local_40);
    std::function<void_(int)>::~function(&local_e0);
    std::__cxx11::string::~string((string *)&it);
  }
  else {
    std::__cxx11::string::string((string *)&local_60);
    iVar1 = this->proxy_port_;
    iVar2 = this->address_family_;
    bVar3 = this->tcp_nodelay_;
    std::function<void_(int)>::function(&local_80,&this->socket_options_);
    this_local._4_4_ =
         detail::create_client_socket
                   (&this->proxy_host_,&local_60,iVar1,iVar2,(bool)(bVar3 & 1),&local_80,
                    this->connection_timeout_sec_,this->connection_timeout_usec_,
                    this->read_timeout_sec_,this->read_timeout_usec_,this->write_timeout_sec_,
                    this->write_timeout_usec_,&this->interface_,local_40);
    std::function<void_(int)>::~function(&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return this_local._4_4_;
}

Assistant:

inline socket_t ClientImpl::create_client_socket(Error &error) const {
  if (!proxy_host_.empty() && proxy_port_ != -1) {
    return detail::create_client_socket(
        proxy_host_, std::string(), proxy_port_, address_family_, tcp_nodelay_,
        socket_options_, connection_timeout_sec_, connection_timeout_usec_,
        read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
        write_timeout_usec_, interface_, error);
  }

  // Check is custom IP specified for host_
  std::string ip;
  auto it = addr_map_.find(host_);
  if (it != addr_map_.end()) ip = it->second;

  return detail::create_client_socket(
      host_, ip, port_, address_family_, tcp_nodelay_, socket_options_,
      connection_timeout_sec_, connection_timeout_usec_, read_timeout_sec_,
      read_timeout_usec_, write_timeout_sec_, write_timeout_usec_, interface_,
      error);
}